

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

void __thiscall Cleaner::LoadDyndeps(Cleaner *this)

{
  bool bVar1;
  reference ppEVar2;
  undefined1 local_48 [8];
  string err;
  Node *dyndep;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_18;
  iterator e;
  Cleaner *this_local;
  
  e._M_current = (Edge **)this;
  local_18._M_current =
       (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(&this->state_->edges_);
  while( true ) {
    dyndep = (Node *)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(&this->state_->edges_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
                       &dyndep);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_18);
    err.field_2._8_8_ = (*ppEVar2)->dyndep_;
    if ((Node *)err.field_2._8_8_ != (Node *)0x0) {
      std::__cxx11::string::string((string *)local_48);
      DyndepLoader::LoadDyndeps(&this->dyndep_loader_,(Node *)err.field_2._8_8_,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
    __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::operator++
              (&local_18);
  }
  return;
}

Assistant:

void Cleaner::LoadDyndeps() {
  // Load dyndep files that exist, before they are cleaned.
  for (vector<Edge*>::iterator e = state_->edges_.begin();
       e != state_->edges_.end(); ++e) {
    if (Node* dyndep = (*e)->dyndep_) {
      // Capture and ignore errors loading the dyndep file.
      // We clean as much of the graph as we know.
      std::string err;
      dyndep_loader_.LoadDyndeps(dyndep, &err);
    }
  }
}